

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::TanHParameter::ByteSizeLong(TanHParameter *this)

{
  bool bVar1;
  TanHParameter_Engine value;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  size_t sStack_28;
  int cached_size;
  size_t total_size;
  TanHParameter *this_local;
  
  sStack_28 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = TanHParameter::unknown_fields(this);
    sStack_28 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  bVar1 = has_engine(this);
  if (bVar1) {
    value = engine(this);
    sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(value);
    sStack_28 = sVar3 + 1 + sStack_28;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_28);
  this->_cached_size_ = iVar2;
  return sStack_28;
}

Assistant:

size_t TanHParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.TanHParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // optional .caffe.TanHParameter.Engine engine = 1 [default = DEFAULT];
  if (has_engine()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->engine());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}